

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::operator-=(SSVectorBase<double> *this,SSVectorBase<double> *vec)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  int __c;
  SSVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  int i;
  undefined8 in_stack_ffffffffffffff98;
  SSVectorBase<double> *in_stack_ffffffffffffffa0;
  VectorBase<double> *in_stack_ffffffffffffffa8;
  VectorBase<double> *this_00;
  SSVectorBase<double> *in_stack_ffffffffffffffb0;
  VectorBase<double> local_30;
  uint local_14;
  SSVectorBase<double> *local_10;
  
  local_10 = in_RSI;
  bVar1 = isSetup(in_RSI);
  if (bVar1) {
    local_14 = size((SSVectorBase<double> *)0x2d9432);
    while (local_14 = local_14 - 1, -1 < (int)local_14) {
      in_stack_ffffffffffffffb0 =
           (SSVectorBase<double> *)
           value(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      this_00 = &in_RDI->super_VectorBase<double>;
      pcVar2 = index(local_10,(char *)(ulong)local_14,__c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this_00->val,(long)(int)pcVar2);
      *pvVar3 = *pvVar3 - (double)in_stack_ffffffffffffffb0;
    }
  }
  else {
    VectorBase<double>::VectorBase(&local_30,&in_RDI->super_VectorBase<double>);
    VectorBase<double>::operator-=
              ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x2d94dd);
  }
  bVar1 = isSetup(in_RDI);
  if (bVar1) {
    in_RDI->setupStatus = false;
    setup(in_stack_ffffffffffffffb0);
  }
  return in_RDI;
}

Assistant:

SSVectorBase<R>& operator-=(const SSVectorBase<S>& vec)
   {
      if(vec.isSetup())
      {
         for(int i = vec.size() - 1; i >= 0; --i)
            VectorBase<R>::val[vec.index(i)] -= vec.value(i);
      }
      else
         VectorBase<R>::operator-=(VectorBase<S>(vec));

      if(isSetup())
      {
         setupStatus = false;
         setup();
      }

      return *this;
   }